

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restincurl.h
# Opt level: O2

void __thiscall restincurl::Request::OpenSourceFile(Request *this,string *path)

{
  int e;
  FILE *__p;
  int *piVar1;
  SystemException *this_00;
  allocator local_61;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  if ((this->fp_).super___shared_ptr<_IO_FILE,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    __assert_fail("!fp_",
                  "/workspace/llm4binary/github/license_c_cmakelists/jgaa[P]RESTinCurl/include/restincurl/restincurl.h"
                  ,0x1e2,"void restincurl::Request::OpenSourceFile(const std::string &)");
  }
  __p = fopen((path->_M_dataplus)._M_p,"rb");
  if (__p != (FILE *)0x0) {
    std::__shared_ptr<_IO_FILE,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<_IO_FILE,int(*)(_IO_FILE*),void>
              ((__shared_ptr<_IO_FILE,(__gnu_cxx::_Lock_policy)2> *)&local_60,(_IO_FILE *)__p,fclose
              );
    std::__shared_ptr<_IO_FILE,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&(this->fp_).super___shared_ptr<_IO_FILE,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<_IO_FILE,_(__gnu_cxx::_Lock_policy)2> *)&local_60);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_60._M_string_length);
    return;
  }
  piVar1 = __errno_location();
  e = *piVar1;
  this_00 = (SystemException *)__cxa_allocate_exception(0x18);
  std::__cxx11::string::string((string *)&local_40,"Unable to open file ",&local_61);
  std::operator+(&local_60,&local_40,path);
  SystemException::SystemException(this_00,&local_60,e);
  __cxa_throw(this_00,&SystemException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

RequestBuilder& Trace(bool enable = true) {
            if (enable) {
                Option(CURLOPT_DEBUGFUNCTION, debug_callback);
                Option(CURLOPT_VERBOSE, 1L);
            } else {
                Option(CURLOPT_VERBOSE, 0L);
            }
            
            return *this;
        }